

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O3

bool __thiscall
glslang::TSmallArrayVector::operator==(TSmallArrayVector *this,TSmallArrayVector *rhs)

{
  TVector<glslang::TArraySize> *pTVar1;
  TVector<glslang::TArraySize> *pTVar2;
  TArraySize *pTVar3;
  TArraySize *this_00;
  pointer rhs_00;
  bool bVar4;
  
  pTVar1 = this->sizes;
  pTVar2 = rhs->sizes;
  bVar4 = pTVar1 == (TVector<glslang::TArraySize> *)0x0 &&
          pTVar2 == (TVector<glslang::TArraySize> *)0x0;
  if (pTVar2 != (TVector<glslang::TArraySize> *)0x0 && pTVar1 != (TVector<glslang::TArraySize> *)0x0
     ) {
    this_00 = (pTVar1->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (pTVar1->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    rhs_00 = (pTVar2->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pTVar3 - (long)this_00 ==
        (long)(pTVar2->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
              super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
      if (this_00 == pTVar3) {
        bVar4 = true;
      }
      else {
        do {
          bVar4 = TArraySize::operator==(this_00,rhs_00);
          if (!bVar4) {
            return bVar4;
          }
          this_00 = this_00 + 1;
          rhs_00 = rhs_00 + 1;
        } while (this_00 != pTVar3);
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool operator==(const TSmallArrayVector& rhs) const
    {
        if (sizes == nullptr && rhs.sizes == nullptr)
            return true;
        if (sizes == nullptr || rhs.sizes == nullptr)
            return false;
        return *sizes == *rhs.sizes;
    }